

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

int UTF_j8_cmp(UTF_C8 *j8a,UTF_C8 *j8b)

{
  bool bVar1;
  char *local_20;
  UTF_C8 *j8b_local;
  UTF_C8 *j8a_local;
  
  local_20 = j8b;
  j8b_local = j8a;
  while( true ) {
    bVar1 = false;
    if (*j8b_local != '\0') {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) {
      if (*j8b_local < *local_20) {
        return -1;
      }
      if (*local_20 < *j8b_local) {
        return 1;
      }
      return 0;
    }
    if (*j8b_local < *local_20) {
      return -1;
    }
    if (*local_20 < *j8b_local) break;
    j8b_local = j8b_local + 1;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

static __inline int
UTF_j8_cmp(const UTF_C8 *j8a, const UTF_C8 *j8b)
{
    while (*j8a && *j8b)
    {
        if (*j8a < *j8b) return -1;
        if (*j8a > *j8b) return 1;
        ++j8a;
        ++j8b;
    }
    if (*j8a < *j8b) return -1;
    if (*j8a > *j8b) return 1;
    return 0;
}